

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O3

uint __thiscall
ON_Object::MoveUserData
          (ON_Object *this,ON_Object *source_object,ON_UUID source_userdata_item_id,
          UserDataConflictResolution userdata_conflict_resolution,bool bDeleteAllSourceItems)

{
  ON_UserData *pOVar1;
  bool bVar2;
  bool bVar3;
  ON_UserData *pOVar4;
  ON_UserData *pOVar5;
  ON_UserData *pOVar6;
  ON_UserData *source_ud_next;
  uint uVar7;
  ON_UUID_struct local_40;
  
  local_40.Data4 = source_userdata_item_id.Data4;
  local_40._0_8_ = source_userdata_item_id._0_8_;
  bVar2 = ::operator==(&ON_nil_uuid,&local_40);
  pOVar4 = source_object->m_userdata_list;
  if ((bVar2) && (this->m_userdata_list == (ON_UserData *)0x0)) {
    uVar7 = 0;
    if (pOVar4 != (ON_UserData *)0x0) {
      this->m_userdata_list = pOVar4;
      source_object->m_userdata_list = (ON_UserData *)0x0;
      pOVar4 = this->m_userdata_list;
      uVar7 = 0;
      if (pOVar4 != (ON_UserData *)0x0) {
        uVar7 = 0;
        do {
          pOVar4->m_userdata_owner = this;
          uVar7 = uVar7 + 1;
          pOVar4 = pOVar4->m_userdata_next;
        } while (pOVar4 != (ON_UserData *)0x0);
      }
    }
  }
  else {
    source_object->m_userdata_list = (ON_UserData *)0x0;
    if (pOVar4 == (ON_UserData *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      pOVar6 = (ON_UserData *)0x0;
      do {
        pOVar1 = pOVar4->m_userdata_next;
        pOVar4->m_userdata_owner = (ON_Object *)0x0;
        pOVar4->m_userdata_next = (ON_UserData *)0x0;
        if (((bVar2) || (bVar3 = ::operator==(&pOVar4->m_userdata_uuid,&local_40), bVar3)) &&
           (pOVar5 = TransferUserDataItem
                               (this,(ON_UserData *)0x0,pOVar4,true,userdata_conflict_resolution),
           pOVar5 != (ON_UserData *)0x0)) {
          uVar7 = uVar7 + 1;
          pOVar4 = pOVar6;
        }
        else if ((pOVar4->m_userdata_owner == (ON_Object *)0x0) &&
                (pOVar4->m_userdata_next == (ON_UserData *)0x0)) {
          if (bDeleteAllSourceItems) {
            (*(pOVar4->super_ON_Object)._vptr_ON_Object[4])(pOVar4);
            pOVar4 = pOVar6;
          }
          else {
            pOVar4->m_userdata_owner = source_object;
            if (source_object->m_userdata_list == (ON_UserData *)0x0) {
              source_object->m_userdata_list = pOVar4;
            }
            else if (pOVar6 != (ON_UserData *)0x0) {
              pOVar6->m_userdata_next = pOVar4;
            }
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                     ,0x68a,"","There is a serious bug in this code.");
          pOVar4 = pOVar6;
        }
        pOVar6 = pOVar4;
        pOVar4 = pOVar1;
      } while (pOVar1 != (ON_UserData *)0x0);
    }
  }
  return uVar7;
}

Assistant:

unsigned int ON_Object::MoveUserData(
  ON_Object& source_object,
  ON_UUID source_userdata_item_id,
  ON_Object::UserDataConflictResolution userdata_conflict_resolution,
  bool bDeleteAllSourceItems)
{
  unsigned int moved_item_count = 0;

  const bool bIgnoreUserDataItemId = (ON_nil_uuid == source_userdata_item_id);

  if ( nullptr == m_userdata_list && bIgnoreUserDataItemId )
  {
    // quick and simple when the "this" doesn't
    // have any user data.
    if ( nullptr != source_object.m_userdata_list )
    {
      m_userdata_list = source_object.m_userdata_list;
      source_object.m_userdata_list = nullptr;
      for (ON_UserData* dest_ud = m_userdata_list; nullptr != dest_ud; dest_ud = dest_ud->m_userdata_next)
      {
        dest_ud->m_userdata_owner = this;
        moved_item_count++;
      }
    }
  }
  else
  {    
    // Carefully move userdata an item at a time from source_object to "this"
    const bool bPerformConflictCheck = true;
    ON_UserData* source_ud_next = source_object.m_userdata_list;
    source_object.m_userdata_list = nullptr;
    ON_UserData* source_object_userdata_last = nullptr;
    for ( ON_UserData* source_ud = source_ud_next; nullptr != source_ud; source_ud = source_ud_next)
    {
      source_ud_next = source_ud->m_userdata_next;
      source_ud->m_userdata_next = nullptr;
      source_ud->m_userdata_owner = nullptr;

      if (bIgnoreUserDataItemId || source_ud->m_userdata_uuid == source_userdata_item_id)
      {
        if (TransferUserDataItem(nullptr, source_ud, bPerformConflictCheck, userdata_conflict_resolution))
        {
          moved_item_count++;
          continue;
        }
      }

      // The transfer did not occur.  Resolve state of orphaned source_ud.
      if (nullptr != source_ud->m_userdata_owner || nullptr != source_ud->m_userdata_next)
      {
        ON_ERROR("There is a serious bug in this code.");
        continue;
      }
      if (bDeleteAllSourceItems)
      {
        // delete the orphan
        delete source_ud;
      }
      else
      {
        // reattach the orphan to source_object
        source_ud->m_userdata_owner = &source_object;
        if (nullptr == source_object.m_userdata_list)
        {
          source_object.m_userdata_list = source_ud;
        }
        else if (nullptr != source_object_userdata_last)
        {
          source_object_userdata_last->m_userdata_next = source_ud;
        }
        source_object_userdata_last = source_ud;
      }
    }
  }

  return moved_item_count;
}